

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_fav.cpp
# Opt level: O2

bool __thiscall
CServerBrowserFavorites::RemoveFavoriteEx
          (CServerBrowserFavorites *this,char *pHostname,NETADDR *pAddr)

{
  int iVar1;
  CFavoriteServer *pCVar2;
  bool bVar3;
  long in_FS_OFFSET;
  int Index;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = 0;
  pCVar2 = FindFavoriteByHostname(this,pHostname,&local_24);
  if (pAddr != (NETADDR *)0x0 && pCVar2 == (CFavoriteServer *)0x0) {
    pCVar2 = FindFavoriteByAddr(this,pAddr,&local_24);
  }
  if (pCVar2 == (CFavoriteServer *)0x0) {
    bVar3 = false;
  }
  else {
    iVar1 = pCVar2->m_State;
    bVar3 = 2 < iVar1;
    if (((iVar1 < 3) && (iVar1 != 2)) && ((this->m_FavLookup).m_FavoriteIndex == local_24)) {
      (this->m_FavLookup).m_FavoriteIndex = -1;
    }
    RemoveFavoriteEntry(this,local_24);
    iVar1 = (this->m_FavLookup).m_FavoriteIndex;
    if (local_24 < iVar1) {
      (this->m_FavLookup).m_FavoriteIndex = iVar1 + -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool CServerBrowserFavorites::RemoveFavoriteEx(const char *pHostname, const NETADDR *pAddr)
{
	bool Result = false;

	// find favorite entry
	int Index = 0;
	CFavoriteServer *pFavEntry = FindFavoriteByHostname(pHostname, &Index);
	if(pFavEntry == 0 && pAddr)
		pFavEntry = FindFavoriteByAddr(*pAddr, &Index);
	if(pFavEntry)
	{
		if(pFavEntry->m_State >= FAVSTATE_ADDR)
		{
			// invalidate favorite state for server entry
			Result = true;
		}
		else if(pFavEntry->m_State <= FAVSTATE_LOOKUPCHECK && m_FavLookup.m_FavoriteIndex == Index)
		{
			// skip result on favorite hostname lookup
			m_FavLookup.m_FavoriteIndex = -1;
		}

		// remove favorite
		RemoveFavoriteEntry(Index);
		if(m_FavLookup.m_FavoriteIndex > Index)
			--m_FavLookup.m_FavoriteIndex;
	}

	return Result;
}